

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_77::BinaryReaderIR::OnLocalNameLocalCount
          (BinaryReaderIR *this,Index index,Index count)

{
  pointer ppFVar1;
  Func *pFVar2;
  pointer pTVar3;
  long lVar4;
  Index IVar5;
  uint uVar6;
  
  ppFVar1 = (this->module_->funcs).super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)index <
      (ulong)((long)(this->module_->funcs).
                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)ppFVar1 >> 3)) {
    pFVar2 = ppFVar1[index];
    pTVar3 = *(pointer *)((long)&(pFVar2->decl).sig.param_types + 8);
    lVar4 = *(long *)&(pFVar2->decl).sig.param_types.
                      super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl;
    IVar5 = LocalTypes::size(&pFVar2->local_types);
    uVar6 = IVar5 + (int)((ulong)((long)pTVar3 - lVar4) >> 2);
    if (uVar6 < count) {
      PrintError(this,"expected local name count (%u) <= local count (%u)",(ulong)count,(ulong)uVar6
                );
    }
    return (Result)(uint)(uVar6 < count);
  }
  __assert_fail("index < module_->funcs.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/binary-reader-ir.cc"
                ,0x493,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnLocalNameLocalCount(Index, Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnLocalNameLocalCount(Index index, Index count) {
  assert(index < module_->funcs.size());
  Func* func = module_->funcs[index];
  Index num_params_and_locals = func->GetNumParamsAndLocals();
  if (count > num_params_and_locals) {
    PrintError("expected local name count (%" PRIindex
               ") <= local count (%" PRIindex ")",
               count, num_params_and_locals);
    return Result::Error;
  }
  return Result::Ok;
}